

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 roundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,uint64_t zSig2,
                   float_status *status)

{
  char cVar1;
  flag fVar2;
  bool bVar3;
  float128 fVar4;
  bool local_63;
  bool local_62;
  bool local_61;
  bool local_53;
  bool local_52;
  bool local_51;
  flag isTiny;
  flag increment;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t zSig2_local;
  uint64_t zSig1_local;
  uint64_t zSig0_local;
  int32_t zExp_local;
  flag zSign_local;
  
  cVar1 = status->float_rounding_mode;
  status_local = (float_status *)zSig2;
  zSig2_local = zSig1;
  zSig1_local = zSig0;
  zSig0_local._0_4_ = zExp;
  zSig0_local._7_1_ = zSign;
  switch(cVar1) {
  case '\0':
  case '\x04':
    local_53 = (long)zSig2 < 0;
    break;
  case '\x01':
    local_52 = zSign != '\0' && zSig2 != 0;
    local_53 = local_52;
    break;
  case '\x02':
    local_51 = zSign == '\0' && zSig2 != 0;
    local_53 = local_51;
    break;
  case '\x03':
    local_53 = false;
    break;
  case '\x05':
    local_53 = (zSig1 & 1) == 0 && zSig2 != 0;
    break;
  default:
    abort();
  }
  if (0x7ffc < (uint)zExp) {
    if ((0x7ffd < zExp) ||
       (((zExp == 0x7ffd &&
         (fVar2 = eq128(0x1ffffffffffff,0xffffffffffffffff,zSig0,zSig1), fVar2 != '\0')) &&
        (local_53)))) {
      float_raise_tricore('(',status);
      if ((cVar1 != '\x03') &&
         ((((zSig0_local._7_1_ == '\0' || (cVar1 != '\x02')) &&
           ((zSig0_local._7_1_ != '\0' || (cVar1 != '\x01')))) && (cVar1 != '\x05')))) {
        fVar4 = packFloat128(zSig0_local._7_1_,0x7fff,0,0);
        return fVar4;
      }
      fVar4 = packFloat128(zSig0_local._7_1_,0x7ffe,0xffffffffffff,0xffffffffffffffff);
      return fVar4;
    }
    if ((int32_t)zSig0_local < 0) {
      if (status->flush_to_zero != '\0') {
        float_raise_tricore(0x80,status);
        fVar4 = packFloat128(zSig0_local._7_1_,0,0,0);
        return fVar4;
      }
      bVar3 = true;
      if (((status->float_detect_tininess != '\x01') && (bVar3 = true, -2 < (int32_t)zSig0_local))
         && (bVar3 = true, local_53)) {
        fVar2 = lt128(zSig1_local,zSig2_local,0x1ffffffffffff,0xffffffffffffffff);
        bVar3 = fVar2 != '\0';
      }
      shift128ExtraRightJamming
                (zSig1_local,zSig2_local,(uint64_t)status_local,-(int32_t)zSig0_local,&zSig1_local,
                 &zSig2_local,(uint64_t *)&status_local);
      zSig0_local._0_4_ = 0;
      if ((bVar3) && (status_local != (float_status *)0x0)) {
        float_raise_tricore('\x10',status);
      }
      switch(cVar1) {
      case '\0':
      case '\x04':
        local_53 = (long)status_local < 0;
        break;
      case '\x01':
        local_62 = zSig0_local._7_1_ != '\0' && status_local != (float_status *)0x0;
        local_53 = local_62;
        break;
      case '\x02':
        local_61 = zSig0_local._7_1_ == '\0' && status_local != (float_status *)0x0;
        local_53 = local_61;
        break;
      case '\x03':
        local_53 = false;
        break;
      case '\x05':
        local_63 = (zSig2_local & 1) == 0 && status_local != (float_status *)0x0;
        local_53 = local_63;
        break;
      default:
        abort();
      }
    }
  }
  if (status_local != (float_status *)0x0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  if (local_53) {
    add128(zSig1_local,zSig2_local,0,1,&zSig1_local,&zSig2_local);
    zSig2_local = (long)(int)((((ulong)status_local & 0x7fffffffffffffff) == 0 && cVar1 == '\0') ^
                             0xffffffff) & zSig2_local;
  }
  else if (zSig1_local == 0 && zSig2_local == 0) {
    zSig0_local._0_4_ = 0;
  }
  fVar4 = packFloat128(zSig0_local._7_1_,(int32_t)zSig0_local,zSig1_local,zSig2_local);
  return fVar4;
}

Assistant:

static float128 roundAndPackFloat128(flag zSign, int32_t zExp,
                                     uint64_t zSig0, uint64_t zSig1,
                                     uint64_t zSig2, float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig2 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig2;
        break;
    case float_round_down:
        increment = zSign && zSig2;
        break;
    case float_round_to_odd:
        increment = !(zSig1 & 0x1) && zSig2;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) zExp ) {
        if (    ( 0x7FFD < zExp )
             || (    ( zExp == 0x7FFD )
                  && eq128(
                         UINT64_C(0x0001FFFFFFFFFFFF),
                         UINT64_C(0xFFFFFFFFFFFFFFFF),
                         zSig0,
                         zSig1
                     )
                  && increment
                )
           ) {
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
                 || (roundingMode == float_round_to_odd)
               ) {
                return
                    packFloat128(
                        zSign,
                        0x7FFE,
                        UINT64_C(0x0000FFFFFFFFFFFF),
                        UINT64_C(0xFFFFFFFFFFFFFFFF)
                    );
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat128(zSign, 0, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ! increment
                || lt128(
                       zSig0,
                       zSig1,
                       UINT64_C(0x0001FFFFFFFFFFFF),
                       UINT64_C(0xFFFFFFFFFFFFFFFF)
                   );
            shift128ExtraRightJamming(
                zSig0, zSig1, zSig2, - zExp, &zSig0, &zSig1, &zSig2 );
            zExp = 0;
            if (isTiny && zSig2) {
                float_raise(float_flag_underflow, status);
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig2 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig2;
                break;
            case float_round_down:
                increment = zSign && zSig2;
                break;
            case float_round_to_odd:
                increment = !(zSig1 & 0x1) && zSig2;
                break;
            default:
                abort();
            }
        }
    }
    if (zSig2) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        add128( zSig0, zSig1, 0, 1, &zSig0, &zSig1 );
        zSig1 &= ~ ( ( zSig2 + zSig2 == 0 ) & roundNearestEven );
    }
    else {
        if ( ( zSig0 | zSig1 ) == 0 ) zExp = 0;
    }
    return packFloat128( zSign, zExp, zSig0, zSig1 );

}